

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubD::SetSubDAppearance(ON_SubD *this,ON_SubDComponentLocation subd_appearance)

{
  ON_SubDComponentLocation OVar1;
  ON_SubDimple *this_00;
  ON_SubDimple *subdimple;
  ON_SubDComponentLocation subd_appearance_local;
  ON_SubD *this_local;
  
  OVar1 = SubDAppearance(this);
  if ((subd_appearance != OVar1) &&
     (((subd_appearance == Surface || (subd_appearance == ControlNet)) &&
      (this_00 = SubDimple(this,true), this_00 != (ON_SubDimple *)0x0)))) {
    ON_SubDimple::SetSubDAppearance(this_00,subd_appearance);
  }
  return;
}

Assistant:

void ON_SubD::SetSubDAppearance(ON_SubDComponentLocation subd_appearance) const
{
  if (
    subd_appearance != SubDAppearance()
    && (ON_SubDComponentLocation::Surface == subd_appearance || ON_SubDComponentLocation::ControlNet == subd_appearance)
    )
  {
    const ON_SubDimple* subdimple = const_cast<ON_SubD*>(this)->SubDimple(true);
    if (nullptr != subdimple)
      subdimple->SetSubDAppearance(subd_appearance);
  }
}